

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asserterror.h
# Opt level: O0

void __thiscall
trun::AssertError::Add
          (AssertError *this,kAssertClass aClass,int pLine,string *pFile,string *pMessage)

{
  undefined1 local_70 [8];
  AssertErrorItem item;
  string *pMessage_local;
  string *pFile_local;
  int pLine_local;
  kAssertClass aClass_local;
  AssertError *this_local;
  
  local_70[0] = aClass;
  local_70._4_4_ = pLine;
  item.message.field_2._8_8_ = pMessage;
  std::__cxx11::string::string((string *)&item,pFile);
  std::__cxx11::string::string((string *)(item.file.field_2._M_local_buf + 8),pMessage);
  std::
  vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>::
  push_back(&this->assertErrors,(value_type *)local_70);
  AssertErrorItem::~AssertErrorItem((AssertErrorItem *)local_70);
  return;
}

Assistant:

void Add(kAssertClass aClass, int pLine, std::string pFile, std::string pMessage) {
            auto item = AssertErrorItem {
                .assertClass = aClass,
                .line = pLine,
                .file = pFile,
                .message = pMessage
            };
            assertErrors.push_back(item);
        }